

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::resizeImpliedBounds(HPresolve *this)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int k;
  vector<double,_std::allocator<double>_> teup;
  vector<double,_std::allocator<double>_> temp;
  size_type in_stack_fffffffffffffdf8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  value_type vVar4;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_4c = 0; local_4c < *(int *)(in_RDI + 8); local_4c = local_4c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *pvVar3 = vVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *pvVar3 = vVar4;
    }
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_50 = 0; local_50 < *(int *)(in_RDI + 8); local_50 = local_50 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (dVar1 < *pvVar3) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vVar4 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        *pvVar3 = vVar4;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *pvVar3 = vVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (*pvVar3 <= dVar1 && dVar1 != *pvVar3) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vVar4 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        *pvVar3 = vVar4;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *pvVar3 = vVar4;
    }
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_54 = 0; local_54 < *(int *)(in_RDI + 0xc); local_54 = local_54 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *pvVar3 = vVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      in_stack_fffffffffffffe98 = (vector<double,_std::allocator<double>_> *)*pvVar3;
      in_stack_fffffffffffffea0 =
           (vector<double,_std::allocator<double>_> *)
           std::vector<double,_std::allocator<double>_>::at
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      (in_stack_fffffffffffffea0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe98;
    }
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_58 = 0; local_58 < *(int *)(in_RDI + 0xc); local_58 = local_58 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (dVar1 < *pvVar3) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vVar4 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        *pvVar3 = vVar4;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *pvVar3 = vVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (*pvVar3 <= dVar1 && dVar1 != *pvVar3) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vVar4 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        *pvVar3 = vVar4;
      }
      in_stack_fffffffffffffe10 =
           (vector<double,_std::allocator<double>_> *)
           std::vector<double,_std::allocator<double>_>::at
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      in_stack_fffffffffffffe00 =
           (vector<double,_std::allocator<double>_> *)
           (in_stack_fffffffffffffe10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      *pvVar3 = (value_type)in_stack_fffffffffffffe00;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe10);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe10);
  return;
}

Assistant:

void HPresolve::resizeImpliedBounds() {
    //implied bounds for crashes
	//row duals
    vector<double> temp = implRowDualLower;
    vector<double> teup = implRowDualUpper;
    implRowDualLower.resize(numRow);
    implRowDualUpper.resize(numRow);

    int k=0;
    for (int i=0;i<numRowOriginal;++i)
    	if (flagRow.at(i)) {
    		implRowDualLower.at(k) = temp.at(i);
    		implRowDualUpper.at(k) = teup.at(i);
    		k++;
	    }

    //row value
    temp = implRowValueLower;
    teup = implRowValueUpper;
    implRowValueLower.resize(numRow);
    implRowValueUpper.resize(numRow);
    k=0;
    for (int i=0;i<numRowOriginal;++i)
    	if (flagRow.at(i)) {
    		if (temp.at(i) < rowLower.at(i))
    			temp.at(i) = rowLower.at(i);
    		implRowValueLower.at(k) = temp.at(i);
    		if (teup.at(i) > rowUpper.at(i))
    			teup.at(i) = rowUpper.at(i);
    		implRowValueUpper.at(k) = teup.at(i);
    		k++;
	    }

    //column dual
    temp = implColDualLower;
    teup = implColDualUpper;
    implColDualLower.resize(numCol);
    implColDualUpper.resize(numCol);

    k=0;
    for (int i=0;i<numColOriginal;++i)
    	if (flagCol.at(i)) {
    		implColDualLower.at(k) = temp.at(i);
    		implColDualUpper.at(k) = teup.at(i);
    		k++;
	    }

    //column value
    temp = implColLower;
    teup = implColUpper;
    implColLower.resize(numCol);
    implColUpper.resize(numCol);

    k=0;
    for (int i=0;i<numColOriginal;++i)
    	if (flagCol.at(i)) {
    		if (temp.at(i) < colLower.at(i))
    			temp.at(i) = colLower.at(i);
    		implColLower.at(k) = temp.at(i);
    		if (teup.at(i) > colUpper.at(i))
    			teup.at(i) = colUpper.at(i);
    		implColUpper.at(k) = teup.at(i);
    		k++;
	    }
}